

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O2

void __thiscall QWizardPrivate::switchToPage(QWizardPrivate *this,int newId,Direction direction)

{
  QWidget *this_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  FocusPolicy FVar4;
  QWidget *pQVar5;
  QWidget *this_01;
  ulong uVar6;
  QWidget *this_02;
  
  this_00 = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  disableUpdates(this);
  iVar2 = this->current;
  pQVar5 = &QWizard::currentPage((QWizard *)this_00)->super_QWidget;
  if ((pQVar5 != (QWidget *)0x0) && (QWidget::hide(pQVar5), direction == Backward)) {
    if (((this->opts).super_QFlagsStorageHelper<QWizard::WizardOption,_4>.
         super_QFlagsStorage<QWizard::WizardOption>.i & 1) == 0) {
      (**(code **)(*(long *)this_00 + 0x1e0))(this_00,iVar2);
      *(undefined1 *)(*(long *)&pQVar5->field_0x8 + 0x30e) = 0;
    }
    QList<int>::removeLast(&this->history);
  }
  this->current = newId;
  pQVar5 = &QWizard::currentPage((QWizard *)this_00)->super_QWidget;
  if (pQVar5 != (QWidget *)0x0) {
    if (direction == Forward) {
      if (*(char *)(*(long *)&pQVar5->field_0x8 + 0x30e) == '\0') {
        *(undefined1 *)(*(long *)&pQVar5->field_0x8 + 0x30e) = 1;
        (**(code **)(*(long *)this_00 + 0x1d8))(this_00,this->current);
      }
      QList<int>::append(&this->history,this->current);
    }
    QWidget::show(pQVar5);
  }
  iVar2 = (**(code **)(*(long *)this_00 + 0x1d0))(this_00);
  this->canContinue = iVar2 != -1;
  if (pQVar5 == (QWidget *)0x0) {
    this->canFinish = false;
    _q_updateButtonStates(this);
    updateButtonTexts(this);
    uVar3 = 1;
  }
  else {
    bVar1 = QWizardPage::isFinalPage((QWizardPage *)pQVar5);
    this->canFinish = bVar1;
    _q_updateButtonStates(this);
    updateButtonTexts(this);
    uVar3 = *(byte *)(*(long *)&pQVar5->field_0x8 + 0x30d) + 1;
  }
  uVar6 = 3;
  if (this->canContinue != false) {
    uVar6 = (ulong)uVar3;
  }
  this_02 = *(QWidget **)((long)&this->field_20 + uVar6 * 8);
  if (((this->opts).super_QFlagsStorageHelper<QWizard::WizardOption,_4>.
       super_QFlagsStorage<QWizard::WizardOption>.i & 8) == 0) {
    if (pQVar5 == (QWidget *)0x0) {
LAB_004c15ba:
      this_01 = (QWidget *)0x0;
      goto LAB_004c15bd;
    }
  }
  else {
    uVar3 = this_02->data->widget_attributes & 1;
    this_01 = (QWidget *)0x0;
    if (uVar3 == 0) {
      this_01 = this_02;
    }
    if ((pQVar5 == (QWidget *)0x0) || (uVar3 == 0)) goto LAB_004c15bd;
  }
  iVar2 = 100;
  this_01 = pQVar5;
  do {
    bVar1 = iVar2 == 0;
    iVar2 = iVar2 + -1;
    if ((bVar1) || (this_01 = QWidget::nextInFocusChain(this_01), this_01 == (QWidget *)0x0))
    goto LAB_004c15ba;
    FVar4 = QWidget::focusPolicy(this_01);
  } while (((this_01 == pQVar5) || ((FVar4 & TabFocus) == NoFocus)) ||
          (bVar1 = QWidget::isAncestorOf(pQVar5,this_01), !bVar1));
LAB_004c15bd:
  if (this_01 != (QWidget *)0x0) {
    this_02 = this_01;
  }
  QWidget::setFocus(this_02);
  if (this->wizStyle == MacStyle) {
    QWidget::updateGeometry(this_00);
  }
  enableUpdates(this);
  updateLayout(this);
  updatePalette(this);
  QWizard::currentIdChanged((QWizard *)this_00,this->current);
  return;
}

Assistant:

void QWizardPrivate::switchToPage(int newId, Direction direction)
{
    Q_Q(QWizard);

    disableUpdates();

    int oldId = current;
    if (QWizardPage *oldPage = q->currentPage()) {
        oldPage->hide();

        if (direction == Backward) {
            if (!(opts & QWizard::IndependentPages)) {
                q->cleanupPage(oldId);
                oldPage->d_func()->initialized = false;
            }
            Q_ASSERT(history.constLast() == oldId);
            history.removeLast();
            Q_ASSERT(history.constLast() == newId);
        }
    }

    current = newId;

    QWizardPage *newPage = q->currentPage();
    if (newPage) {
        if (direction == Forward) {
            if (!newPage->d_func()->initialized) {
                newPage->d_func()->initialized = true;
                q->initializePage(current);
            }
            history.append(current);
        }
        newPage->show();
    }

    canContinue = (q->nextId() != -1);
    canFinish = (newPage && newPage->isFinalPage());

    _q_updateButtonStates();
    updateButtonTexts();

    const QWizard::WizardButton nextOrCommit =
        newPage && newPage->isCommitPage() ? QWizard::CommitButton : QWizard::NextButton;
    QAbstractButton *nextOrFinishButton =
        btns[canContinue ? nextOrCommit : QWizard::FinishButton];
    QWidget *candidate = nullptr;

    /*
        If there is no default button and the Next or Finish button
        is enabled, give focus directly to it as a convenience to the
        user. This is the normal case on OS X.

        Otherwise, give the focus to the new page's first child that
        can handle it. If there is no such child, give the focus to
        Next or Finish.
    */
    if ((opts & QWizard::NoDefaultButton) && nextOrFinishButton->isEnabled()) {
        candidate = nextOrFinishButton;
    } else if (newPage) {
        candidate = iWantTheFocus(newPage);
    }
    if (!candidate)
        candidate = nextOrFinishButton;
    candidate->setFocus();

    if (wizStyle == QWizard::MacStyle)
        q->updateGeometry();

    enableUpdates();
    updateLayout();
    updatePalette();

    emit q->currentIdChanged(current);
}